

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

PAL_ERROR MAPmmapAndRecord(IPalObject *pMappingObject,void *pPEBaseAddress,void *addr,size_t len,
                          int prot,int flags,int fd,off_t offset,LPVOID *ppvBaseAddress)

{
  PAL_ERROR PVar1;
  int iVar2;
  DWORD DVar3;
  undefined1 *addr_00;
  int *piVar4;
  undefined4 in_stack_0000000c;
  
  if (pPEBaseAddress == (void *)0x0) {
    fprintf(_stderr,"] %s %s:%d","MAPmmapAndRecord",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x8a6);
    fprintf(_stderr,"Expression: pPEBaseAddress != NULL\n");
  }
  addr_00 = (undefined1 *)mmap64(addr,len,prot,0x12,flags,CONCAT44(in_stack_0000000c,fd));
  if (addr_00 == &DAT_ffffffffffffffff) {
    if (PAL_InitializeChakraCoreCalled != false) {
      piVar4 = __errno_location();
      strerror(*piVar4);
      DVar3 = FILEGetLastErrorFromErrno();
      return DVar3;
    }
LAB_001307c8:
    abort();
  }
  PVar1 = MAPRecordMapping(pMappingObject,pPEBaseAddress,addr_00,len,prot);
  if (PVar1 == 0) {
    *(undefined1 **)offset = addr_00;
  }
  else {
    iVar2 = munmap(addr_00,len);
    if ((iVar2 == -1) && (PAL_InitializeChakraCoreCalled == false)) goto LAB_001307c8;
  }
  return PVar1;
}

Assistant:

static PAL_ERROR
MAPmmapAndRecord(
    IPalObject *pMappingObject,
    void *pPEBaseAddress,
    void *addr,
    size_t len,
    int prot,
    int flags,
    int fd,
    off_t offset,
    LPVOID *ppvBaseAddress
    )
{
    _ASSERTE(pPEBaseAddress != NULL);

    PAL_ERROR palError = NO_ERROR;
    LPVOID pvBaseAddress = NULL;

    pvBaseAddress = mmap(addr, len, prot, flags, fd, offset);
    if (MAP_FAILED == pvBaseAddress)
    {
        ERROR_(LOADER)( "mmap failed with code %d: %s.\n", errno, strerror( errno ) );
        palError = FILEGetLastErrorFromErrno();
    }
    else
    {
        palError = MAPRecordMapping(pMappingObject, pPEBaseAddress, pvBaseAddress, len, prot);
        if (NO_ERROR != palError)
        {
            if (-1 == munmap(pvBaseAddress, len))
            {
                ERROR_(LOADER)("Unable to unmap the file. Expect trouble.\n");
            }
        }
        else
        {
            *ppvBaseAddress = pvBaseAddress;
        }
    }

    return palError;
}